

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::anon_unknown_5::MthdDvdSrcFormat::emulate_mthd(MthdDvdSrcFormat *this)

{
  uint32_t *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = this->which;
  uVar3 = 0x10000;
  if (iVar2 == 0) {
    uVar3 = 0x400;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
  *puVar1 = *puVar1 | uVar3;
  uVar3 = (uint)*(ushort *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 2);
  if (iVar2 != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format =
         (uVar3 & 3) << 8 |
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format & 0xfffffcff;
    return;
  }
  uVar3 = uVar3 & 3;
  uVar5 = 0x12;
  if (uVar3 != 1) {
    uVar5 = 0;
  }
  uVar4 = 0x13;
  if (uVar3 != 2) {
    uVar4 = uVar5;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format & 0xffffffc0 |
       uVar4;
  return;
}

Assistant:

void emulate_mthd() override {
		insrt(exp.valid[0], which ? 16 : 10, 1, 1);
		int sfmt = extr(val, 16, 2);
		if (which == 0) {
			int fmt = 0;
			if (sfmt == 1)
				fmt = 0x12;
			if (sfmt == 2)
				fmt = 0x13;
			insrt(exp.dvd_format, 0, 6, fmt);
		} else {
			insrt(exp.dvd_format, 8, 2, sfmt);
		}
	}